

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norms.cpp
# Opt level: O0

void __thiscall
icu_63::Decomposer::rangeHandler(Decomposer *this,UChar32 start,UChar32 end,Norm *norm)

{
  UnicodeString *this_00;
  Norms *this_01;
  int srcStart;
  UBool UVar1;
  byte bVar2;
  byte bVar3;
  int32_t iVar4;
  UChar32 c_00;
  int32_t iVar5;
  uint c_01;
  char16_t *p;
  UChar *pUVar6;
  Norm *this_02;
  UnicodeString *pUVar7;
  int iVar8;
  size_t size;
  UChar *buffer_00;
  UnicodeString *local_d8;
  UnicodeString *local_c8;
  ConstChar16Ptr local_a8;
  undefined1 local_99;
  UnicodeString *local_98;
  int32_t local_90;
  UChar local_8a;
  int32_t hangulLength;
  UChar buffer [3];
  uint8_t cTrailCC;
  UChar32 cTrailChar;
  uint8_t myTrailCC;
  Norm *cNorm;
  uint local_48;
  int iStack_44;
  uint16_t __c2;
  UChar32 c;
  int32_t i;
  int32_t prev;
  int32_t length;
  UChar *s;
  UnicodeString *decomposed;
  UnicodeString *m;
  Norm *norm_local;
  UChar32 end_local;
  UChar32 start_local;
  Decomposer *this_local;
  
  UVar1 = Norm::hasMapping(norm);
  if (UVar1 != '\0') {
    this_00 = norm->mapping;
    s = (UChar *)0x0;
    p = UnicodeString::getBuffer(this_00);
    pUVar6 = toUCharPtr(p);
    iVar4 = UnicodeString::length(this_00);
    iStack_44 = 0;
    while (srcStart = iStack_44, iStack_44 < iVar4) {
      iVar8 = iStack_44 + 1;
      local_48 = (uint)(ushort)pUVar6[iStack_44];
      if ((((local_48 & 0xfffffc00) == 0xd800) && (iVar8 != iVar4)) &&
         ((pUVar6[iVar8] & 0xfc00U) == 0xdc00)) {
        local_48 = local_48 * 0x400 + (uint)(ushort)pUVar6[iVar8] + 0xfca02400;
        iVar8 = iStack_44 + 2;
      }
      iStack_44 = iVar8;
      if ((start <= (int)local_48) && ((int)local_48 <= end)) {
        fprintf(_stderr,"gennorm2 error: U+%04lX maps to itself directly or indirectly\n",
                (long)(int)local_48);
        exit(3);
      }
      size = (size_t)local_48;
      this_02 = Norms::getNormRef((this->super_Enumerator).norms,local_48);
      UVar1 = Norm::hasMapping(this_02);
      if (UVar1 == '\0') {
        UVar1 = Hangul::isHangul(local_48);
        if (UVar1 == '\0') {
          if (s != (UChar *)0x0) {
            UnicodeString::append((UnicodeString *)s,this_00,srcStart,iStack_44 - srcStart);
          }
        }
        else {
          buffer_00 = &local_8a;
          local_90 = Hangul::decompose(local_48,buffer_00);
          if ((norm->mappingType == ROUND_TRIP) && (srcStart != 0)) {
            fprintf(_stderr,
                    "gennorm2 error: U+%04lX\'s round-trip mapping\'s non-starter U+%04lX decomposes, not possible in Unicode normalization\n"
                    ,(long)start,(long)(int)local_48);
            exit(3);
          }
          if (s == (UChar *)0x0) {
            pUVar7 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)buffer_00);
            local_99 = 0;
            local_d8 = (UnicodeString *)0x0;
            if (pUVar7 != (UnicodeString *)0x0) {
              local_99 = 1;
              local_98 = pUVar7;
              UnicodeString::UnicodeString(pUVar7,this_00,0,srcStart);
              local_d8 = pUVar7;
            }
            s = (UChar *)local_d8;
          }
          ConstChar16Ptr::ConstChar16Ptr(&local_a8,&local_8a);
          UnicodeString::append((UnicodeString *)s,&local_a8,local_90);
          ConstChar16Ptr::~ConstChar16Ptr(&local_a8);
        }
      }
      else {
        if (norm->mappingType == ROUND_TRIP) {
          if (srcStart != 0) {
            fprintf(_stderr,
                    "gennorm2 error: U+%04lX\'s round-trip mapping\'s non-starter U+%04lX decomposes, not possible in Unicode normalization\n"
                    ,(long)start,(long)(int)local_48);
            exit(3);
          }
          if (this_02->mappingType != ROUND_TRIP) {
            fprintf(_stderr,
                    "gennorm2 error: U+%04lX\'s round-trip mapping\'s starter U+%04lX one-way-decomposes, not possible in Unicode normalization\n"
                    ,(long)start,(long)(int)local_48);
            exit(3);
          }
          this_01 = (this->super_Enumerator).norms;
          c_00 = UnicodeString::char32At(this_00,iStack_44);
          bVar2 = Norms::getCC(this_01,c_00);
          pUVar7 = this_02->mapping;
          iVar5 = UnicodeString::length(this_02->mapping);
          c_01 = UnicodeString::char32At(pUVar7,iVar5 + -1);
          size = (size_t)c_01;
          bVar3 = Norms::getCC((this->super_Enumerator).norms,c_01);
          if (bVar2 < bVar3) {
            fprintf(_stderr,
                    "gennorm2 error: U+%04lX\'s round-trip mapping\'s starter U+%04lX decomposes and the inner/earlier tccc=%hu > outer/following tccc=%hu, not possible in Unicode normalization\n"
                    ,(long)start,(long)(int)local_48,(ulong)(uint)(int)(short)(ushort)bVar3,
                    (ulong)(uint)(int)(short)(ushort)bVar2);
            exit(3);
          }
        }
        if (s == (UChar *)0x0) {
          pUVar7 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,size);
          local_c8 = (UnicodeString *)0x0;
          if (pUVar7 != (UnicodeString *)0x0) {
            UnicodeString::UnicodeString(pUVar7,this_00,0,srcStart);
            local_c8 = pUVar7;
          }
          s = (UChar *)local_c8;
        }
        UnicodeString::append((UnicodeString *)s,this_02->mapping);
      }
    }
    if (s != (UChar *)0x0) {
      if (norm->rawMapping == (UnicodeString *)0x0) {
        norm->rawMapping = norm->mapping;
      }
      else if (norm->mapping != (UnicodeString *)0x0) {
        (*(norm->mapping->super_Replaceable).super_UObject._vptr_UObject[1])();
      }
      norm->mapping = (UnicodeString *)s;
      this->didDecompose = this->didDecompose | 1;
    }
  }
  return;
}

Assistant:

void Decomposer::rangeHandler(UChar32 start, UChar32 end, Norm &norm) {
    if(!norm.hasMapping()) { return; }
    const UnicodeString &m=*norm.mapping;
    UnicodeString *decomposed=nullptr;
    const UChar *s=toUCharPtr(m.getBuffer());
    int32_t length=m.length();
    int32_t prev, i=0;
    UChar32 c;
    while(i<length) {
        prev=i;
        U16_NEXT(s, i, length, c);
        if(start<=c && c<=end) {
            fprintf(stderr,
                    "gennorm2 error: U+%04lX maps to itself directly or indirectly\n",
                    (long)c);
            exit(U_INVALID_FORMAT_ERROR);
        }
        const Norm &cNorm=norms.getNormRef(c);
        if(cNorm.hasMapping()) {
            if(norm.mappingType==Norm::ROUND_TRIP) {
                if(prev==0) {
                    if(cNorm.mappingType!=Norm::ROUND_TRIP) {
                        fprintf(stderr,
                                "gennorm2 error: "
                                "U+%04lX's round-trip mapping's starter "
                                "U+%04lX one-way-decomposes, "
                                "not possible in Unicode normalization\n",
                                (long)start, (long)c);
                        exit(U_INVALID_FORMAT_ERROR);
                    }
                    uint8_t myTrailCC=norms.getCC(m.char32At(i));
                    UChar32 cTrailChar=cNorm.mapping->char32At(cNorm.mapping->length()-1);
                    uint8_t cTrailCC=norms.getCC(cTrailChar);
                    if(cTrailCC>myTrailCC) {
                        fprintf(stderr,
                                "gennorm2 error: "
                                "U+%04lX's round-trip mapping's starter "
                                "U+%04lX decomposes and the "
                                "inner/earlier tccc=%hu > outer/following tccc=%hu, "
                                "not possible in Unicode normalization\n",
                                (long)start, (long)c,
                                (short)cTrailCC, (short)myTrailCC);
                        exit(U_INVALID_FORMAT_ERROR);
                    }
                } else {
                    fprintf(stderr,
                            "gennorm2 error: "
                            "U+%04lX's round-trip mapping's non-starter "
                            "U+%04lX decomposes, "
                            "not possible in Unicode normalization\n",
                            (long)start, (long)c);
                    exit(U_INVALID_FORMAT_ERROR);
                }
            }
            if(decomposed==nullptr) {
                decomposed=new UnicodeString(m, 0, prev);
            }
            decomposed->append(*cNorm.mapping);
        } else if(Hangul::isHangul(c)) {
            UChar buffer[3];
            int32_t hangulLength=Hangul::decompose(c, buffer);
            if(norm.mappingType==Norm::ROUND_TRIP && prev!=0) {
                fprintf(stderr,
                        "gennorm2 error: "
                        "U+%04lX's round-trip mapping's non-starter "
                        "U+%04lX decomposes, "
                        "not possible in Unicode normalization\n",
                        (long)start, (long)c);
                exit(U_INVALID_FORMAT_ERROR);
            }
            if(decomposed==nullptr) {
                decomposed=new UnicodeString(m, 0, prev);
            }
            decomposed->append(buffer, hangulLength);
        } else if(decomposed!=nullptr) {
            decomposed->append(m, prev, i-prev);
        }
    }
    if(decomposed!=nullptr) {
        if(norm.rawMapping==nullptr) {
            // Remember the original mapping when decomposing recursively.
            norm.rawMapping=norm.mapping;
        } else {
            delete norm.mapping;
        }
        norm.mapping=decomposed;
        // Not  norm.setMappingCP();  because the original mapping
        // is most likely to be encodable as a delta.
        didDecompose|=TRUE;
    }
}